

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O2

void __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)1>::Iterator::Iterator
          (Iterator *this,SparseMatrix<(iDynTree::MatrixStorageOrdering)1> *matrix,bool valid)

{
  size_t sVar1;
  
  this->m_matrix = matrix;
  this->m_index = -1;
  TripletRef::TripletRef
            (&this->m_currentTriplet,0xffffffffffffffff,0xffffffffffffffff,(double *)0x0);
  this->m_nonZerosInOuterDirection = 1;
  sVar1 = VectorDynSize::size(&matrix->m_values);
  if (sVar1 != 0 && valid) {
    this->m_index = 0;
    updateTriplet(this);
    return;
  }
  return;
}

Assistant:

SparseMatrix<ordering>::Iterator::Iterator(iDynTree::SparseMatrix<ordering> &matrix, bool valid)
    : m_matrix(matrix)
    , m_index(-1)
    , m_currentTriplet(-1, -1, 0)
    , m_nonZerosInOuterDirection(1) //to initialize the counter
    {
        if (matrix.m_values.size() == 0 || !valid) return;
        m_index = 0;

        updateTriplet();
    }